

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswConstr.c
# Opt level: O2

void Ssw_ManRefineByConstrSim(Ssw_Man_t *p)

{
  undefined1 *puVar1;
  int iVar2;
  uint uVar3;
  void *pvVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  Aig_Man_t *pAVar7;
  int iVar8;
  char *format;
  Vec_Ptr_t *p_00;
  int i;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  
  pAVar7 = p->pAig;
  iVar8 = p->vInits->nSize;
  uVar11 = iVar8 / pAVar7->nTruePis;
  if (iVar8 % pAVar7->nTruePis != 0) {
    __assert_fail("Vec_IntSize(p->vInits) % Saig_ManPiNum(p->pAig) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswConstr.c"
                  ,0xfc,"void Ssw_ManRefineByConstrSim(Ssw_Man_t *)");
  }
  for (iVar8 = 0; iVar8 < pAVar7->nRegs; iVar8 = iVar8 + 1) {
    pvVar4 = Vec_PtrEntry(pAVar7->vCos,pAVar7->nTruePos + iVar8);
    *(byte *)((long)pvVar4 + 0x18) = *(byte *)((long)pvVar4 + 0x18) & 0xdf;
    pAVar7 = p->pAig;
  }
  if ((int)uVar11 < 1) {
    uVar11 = 0;
  }
  iVar8 = 0;
  for (uVar12 = 0; uVar12 != uVar11; uVar12 = uVar12 + 1) {
    puVar1 = &p->pAig->pConst1->field_0x18;
    *(ulong *)puVar1 = *(ulong *)puVar1 | 0x20;
    i = 0;
    while( true ) {
      pAVar7 = p->pAig;
      if (pAVar7->nTruePis <= i) break;
      pvVar4 = Vec_PtrEntry(pAVar7->vCis,i);
      uVar3 = Vec_IntEntry(p->vInits,i + iVar8);
      *(ulong *)((long)pvVar4 + 0x18) =
           *(ulong *)((long)pvVar4 + 0x18) & 0xffffffffffffffdf | (ulong)((uVar3 & 1) << 5);
      i = i + 1;
    }
    for (iVar9 = 0; iVar9 < pAVar7->nRegs; iVar9 = iVar9 + 1) {
      pAVar5 = Saig_ManLi(pAVar7,iVar9);
      pAVar6 = Saig_ManLo(p->pAig,iVar9);
      *(ulong *)&pAVar6->field_0x18 =
           *(ulong *)&pAVar6->field_0x18 & 0xffffffffffffffdf |
           (ulong)((uint)*(undefined8 *)&pAVar5->field_0x18 & 0x20);
      pAVar7 = p->pAig;
    }
    for (iVar9 = 0; iVar9 < pAVar7->vObjs->nSize; iVar9 = iVar9 + 1) {
      pvVar4 = Vec_PtrEntry(pAVar7->vObjs,iVar9);
      if ((pvVar4 != (void *)0x0) && (0xfffffffd < ((uint)*(ulong *)((long)pvVar4 + 0x18) & 7) - 7))
      {
        *(ulong *)((long)pvVar4 + 0x18) =
             *(ulong *)((long)pvVar4 + 0x18) & 0xffffffffffffffdf |
             (ulong)((((uint)*(ulong *)((long)pvVar4 + 0x10) ^
                      *(uint *)((*(ulong *)((long)pvVar4 + 0x10) & 0xfffffffffffffffe) + 0x18) >> 5)
                      & ((uint)*(ulong *)((long)pvVar4 + 8) ^
                        *(uint *)((*(ulong *)((long)pvVar4 + 8) & 0xfffffffffffffffe) + 0x18) >> 5)
                     & 1) << 5);
      }
      pAVar7 = p->pAig;
    }
    for (iVar9 = 0; iVar9 < pAVar7->vCos->nSize; iVar9 = iVar9 + 1) {
      pvVar4 = Vec_PtrEntry(pAVar7->vCos,iVar9);
      *(ulong *)((long)pvVar4 + 0x18) =
           *(ulong *)((long)pvVar4 + 0x18) & 0xffffffffffffffdf |
           (ulong)(((int)*(ulong *)((long)pvVar4 + 8) << 5 ^
                   *(uint *)((*(ulong *)((long)pvVar4 + 8) & 0xfffffffffffffffe) + 0x18)) & 0x20);
      pAVar7 = p->pAig;
    }
    uVar10 = 0;
    while (iVar9 = (int)uVar10, iVar9 < pAVar7->nTruePos) {
      p_00 = pAVar7->vCos;
      pvVar4 = Vec_PtrEntry(p_00,iVar9);
      iVar2 = p->pAig->nConstrs;
      if ((iVar2 != 0) && ((*(ulong *)((long)pvVar4 + 0x18) & 0x20) != 0)) {
        format = "constraint %d failed in frame %d.\n";
        if (iVar9 < p->pAig->nTruePos - iVar2) {
          format = "output %d failed in frame %d.\n";
        }
        Abc_Print((int)p_00,format,uVar10,(ulong)uVar12);
      }
      pAVar7 = p->pAig;
      uVar10 = (ulong)(iVar9 + 1);
    }
    if (uVar12 == 0) {
      iVar9 = 0;
      while( true ) {
        if (pAVar7->vObjs->nSize <= iVar9) break;
        pvVar4 = Vec_PtrEntry(pAVar7->vObjs,iVar9);
        if (pvVar4 != (void *)0x0) {
          *(ulong *)((long)pvVar4 + 0x18) =
               *(ulong *)((long)pvVar4 + 0x18) & 0xfffffffffffffff7 |
               (ulong)((uint)(*(ulong *)((long)pvVar4 + 0x18) >> 2) & 8);
        }
        iVar9 = iVar9 + 1;
        pAVar7 = p->pAig;
      }
    }
    else {
      Ssw_ClassesRefineConst1(p->ppClasses,0);
      Ssw_ClassesRefine(p->ppClasses,0);
    }
    iVar8 = i + iVar8;
  }
  if (iVar8 == p->vInits->nSize) {
    return;
  }
  __assert_fail("iLits == Vec_IntSize(p->vInits)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswConstr.c"
                ,299,"void Ssw_ManRefineByConstrSim(Ssw_Man_t *)");
}

Assistant:

void Ssw_ManRefineByConstrSim( Ssw_Man_t * p )
{
    Aig_Obj_t * pObj, * pObjLi;
    int f, i, iLits, RetValue1, RetValue2;
    int nFrames = Vec_IntSize(p->vInits) / Saig_ManPiNum(p->pAig);
    assert( Vec_IntSize(p->vInits) % Saig_ManPiNum(p->pAig) == 0 );
    // assign register outputs
    Saig_ManForEachLi( p->pAig, pObj, i )
        pObj->fMarkB = 0;
    // simulate the timeframes
    iLits = 0;
    for ( f = 0; f < nFrames; f++ )
    {
        // set the PI simulation information
        Aig_ManConst1(p->pAig)->fMarkB = 1;
        Saig_ManForEachPi( p->pAig, pObj, i )
            pObj->fMarkB = Vec_IntEntry( p->vInits, iLits++ );
        Saig_ManForEachLiLo( p->pAig, pObjLi, pObj, i )
            pObj->fMarkB = pObjLi->fMarkB;
        // simulate internal nodes
        Aig_ManForEachNode( p->pAig, pObj, i )
            pObj->fMarkB = ( Aig_ObjFanin0(pObj)->fMarkB ^ Aig_ObjFaninC0(pObj) )
                         & ( Aig_ObjFanin1(pObj)->fMarkB ^ Aig_ObjFaninC1(pObj) );
        // assign the COs
        Aig_ManForEachCo( p->pAig, pObj, i )
            pObj->fMarkB = ( Aig_ObjFanin0(pObj)->fMarkB ^ Aig_ObjFaninC0(pObj) );
        // check the outputs
        Saig_ManForEachPo( p->pAig, pObj, i )
        {
            if ( i < Saig_ManPoNum(p->pAig) - Saig_ManConstrNum(p->pAig) )
            {
                if ( pObj->fMarkB && Saig_ManConstrNum(p->pAig) )
                    Abc_Print( 1, "output %d failed in frame %d.\n", i, f );
            }
            else
            {
                if ( pObj->fMarkB && Saig_ManConstrNum(p->pAig) )
                    Abc_Print( 1, "constraint %d failed in frame %d.\n", i, f );
            }
        }
        // transfer
        if ( f == 0 )
        { // copy markB into phase
            Aig_ManForEachObj( p->pAig, pObj, i )
                pObj->fPhase = pObj->fMarkB;
        }
        else
        { // refine classes
            RetValue1 = Ssw_ClassesRefineConst1( p->ppClasses, 0 );
            RetValue2 = Ssw_ClassesRefine( p->ppClasses, 0 );
        }
    }
    assert( iLits == Vec_IntSize(p->vInits) );
}